

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O1

int __thiscall
sockpp::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int s;
  sockaddr *__addr_00;
  undefined8 uVar1;
  socklen_t *__addr_len_00;
  undefined4 in_register_00000034;
  socklen_t len;
  result<int> res;
  socklen_t local_6c;
  result<int> local_68;
  undefined **local_50;
  undefined4 local_48;
  socket local_40;
  
  local_6c = 0;
  if (__addr == (sockaddr *)0x0) {
    __addr_00 = (sockaddr *)0x0;
    __addr_len_00 = (socklen_t *)0x0;
  }
  else {
    __addr_00 = (sockaddr *)(**(code **)(*(long *)__addr + 0x18))(__addr);
    local_6c = (**(code **)(*(long *)__addr + 0x10))(__addr);
    __addr_len_00 = &local_6c;
  }
  s = ::accept(*(int *)(CONCAT44(in_register_00000034,__fd) + 8),__addr_00,__addr_len_00);
  socket::check_socket(&local_68,s);
  if (local_68.err_._M_value == 0) {
    local_50 = &PTR__socket_0010cc58;
    (this->super_socket)._vptr_socket = (_func_int **)&PTR__socket_0010cba0;
    (this->super_socket).handle_ = local_68.val_;
    local_48 = 0xffffffff;
    (this->super_socket)._vptr_socket = (_func_int **)&PTR__socket_0010cc58;
    *(undefined4 *)&this[1].super_socket._vptr_socket = 0;
    uVar1 = std::_V2::system_category();
    *(undefined8 *)&this[1].super_socket.handle_ = uVar1;
    local_50 = &PTR__socket_0010cba0;
    socket::close(&local_40,(int)&local_50);
  }
  else {
    (this->super_socket).handle_ = -1;
    (this->super_socket)._vptr_socket = (_func_int **)&PTR__socket_0010cc58;
    this[1].super_socket._vptr_socket =
         (_func_int **)CONCAT44(local_68.err_._4_4_,local_68.err_._M_value);
    *(error_category **)&this[1].super_socket.handle_ = local_68.err_._M_cat;
  }
  return (int)this;
}

Assistant:

result<stream_socket> acceptor::accept(sock_address* clientAddr /*=nullptr*/) noexcept {
    sockaddr* p = clientAddr ? clientAddr->sockaddr_ptr() : nullptr;
    socklen_t len = clientAddr ? clientAddr->size() : 0;

    if (auto res = check_socket(::accept(handle(), p, clientAddr ? &len : nullptr)); !res)
        return res.error();
    else
        return stream_socket{res.value()};
}